

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::emitInstance(SemanticParser *this,SP *pbrtInstance)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  SP SVar11;
  SP SVar12;
  undefined1 local_48 [40];
  
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Instance,std::allocator<pbrt::Instance>>
            (&(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(Instance **)this,(allocator<pbrt::Instance> *)local_48);
  std::__shared_ptr<pbrt::Instance,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::Instance,pbrt::Instance>
            ((__shared_ptr<pbrt::Instance,(__gnu_cxx::_Lock_policy)2> *)this,
             (Instance *)
             (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  lVar1 = *in_RDX;
  peVar2 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar4 = *(pointer *)(lVar1 + 0x10);
  peVar5 = *(element_type **)(lVar1 + 0x18);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
  peVar6 = *(element_type **)(lVar1 + 0x28);
  peVar7 = *(element_type **)(lVar1 + 0x38);
  (peVar2->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x30);
  (peVar2->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar7;
  (peVar2->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  (peVar2->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  *(pointer *)
   ((long)&(peVar2->cameras).
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = psVar4;
  (peVar2->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  local_48._24_8_ = *(undefined8 *)*in_RDX;
  local_48._32_8_ = ((undefined8 *)*in_RDX)[1];
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_)->_M_use_count + 1;
    }
  }
  SVar11 = findOrEmitObject((SemanticParser *)local_48,(SP *)pbrtInstance);
  uVar9 = local_48._8_8_;
  uVar8 = local_48._0_8_;
  _Var10 = SVar11.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar2 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(peVar2->cameras).
                    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  (peVar2->cameras).
  super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar8;
  *(undefined8 *)
   ((long)&(peVar2->cameras).
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 8) = uVar9;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    _Var10._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    _Var10._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._32_8_);
    _Var10._M_pi = extraout_RDX_01;
  }
  SVar12.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  SVar12.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar12.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Instance::SP SemanticParser::emitInstance(pbrt::syntactic::Object::Instance::SP pbrtInstance)
  {
    Instance::SP ourInstance
      = std::make_shared<Instance>();
    ourInstance->xfm    = (const affine3f&)pbrtInstance->xfm.atStart;
    ourInstance->object = findOrEmitObject(pbrtInstance->object);
    return ourInstance;
  }